

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

PolymorphicEmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitIfElseExpr(WasmBytecodeGenerator *this)

{
  bool bVar1;
  WasmReaderBase *pWVar2;
  WasmCompilationException *this_00;
  PolymorphicEmitInfo PVar3;
  EmitInfo local_68;
  EmitInfo falseExpr;
  EmitInfo retInfo;
  bool local_41;
  WasmBlock WStack_40;
  bool endOnElse;
  BlockInfo *local_38;
  BlockInfo *blockInfo;
  EmitInfo checkExpr;
  ByteCodeLabel endLabel;
  ByteCodeLabel falseLabel;
  WasmBytecodeGenerator *this_local;
  
  checkExpr.type = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  checkExpr.super_EmitInfoBase.location = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  blockInfo = (BlockInfo *)PopEvalStack(this,FirstLocalType,L"If expression must have type i32");
  ReleaseLocation(this,(EmitInfo *)&blockInfo);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1a])
            (this->m_writer,0x27,(ulong)checkExpr.type,(ulong)blockInfo & 0xffffffff);
  pWVar2 = GetReader(this);
  WStack_40 = (pWVar2->m_currentNode).field_1.block;
  local_38 = PushLabel(this,WStack_40,checkExpr.super_EmitInfoBase.location,true,true);
  local_41 = false;
  EmitBlockCommon(this,local_38,&local_41);
  EnsureYield(this,local_38);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])
            (this->m_writer,(ulong)checkExpr.super_EmitInfoBase.location,0x25);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)checkExpr.type);
  EmitInfo::EmitInfo(&falseExpr);
  EmitInfo::EmitInfo(&local_68);
  if ((local_41 & 1U) == 0) {
    bVar1 = BlockInfo::HasYield(local_38);
    if (bVar1) {
      this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (this_00,L"Expected an else block when \'if\' returns a value");
      __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                  WasmCompilationException::~WasmCompilationException);
    }
  }
  else {
    bVar1 = BlockInfo::HasYield(local_38);
    if (bVar1) {
      local_38->didYield = false;
    }
    EmitBlockCommon(this,local_38,(bool *)0x0);
    EnsureYield(this,local_38);
  }
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])
            (this->m_writer,(ulong)checkExpr.super_EmitInfoBase.location);
  PVar3 = PopLabel(this,checkExpr.super_EmitInfoBase.location);
  PVar3._4_4_ = 0;
  return PVar3;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitIfElseExpr()
{
    Js::ByteCodeLabel falseLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel endLabel = m_writer->DefineLabel();

    EmitInfo checkExpr = PopEvalStack(WasmTypes::I32, _u("If expression must have type i32"));
    ReleaseLocation(&checkExpr);

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrFalse_Int, falseLabel, checkExpr.location);

    BlockInfo* blockInfo = PushLabel(GetReader()->m_currentNode.block, endLabel);
    bool endOnElse = false;
    EmitBlockCommon(blockInfo, &endOnElse);
    EnsureYield(blockInfo);

    m_writer->AsmBr(endLabel);
    m_writer->MarkAsmJsLabel(falseLabel);

    EmitInfo retInfo;
    EmitInfo falseExpr;
    if (endOnElse)
    {
        if (blockInfo->HasYield())
        {
            // Indicate that we need this block to yield a value
            blockInfo->didYield = false;
        }
        EmitBlockCommon(blockInfo);
        EnsureYield(blockInfo);
    }
    else if (blockInfo->HasYield())
    {
        throw WasmCompilationException(_u("Expected an else block when 'if' returns a value"));
    }
    m_writer->MarkAsmJsLabel(endLabel);

    return PopLabel(endLabel);
}